

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpInitialStmtSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpInitialStmtSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax *args_3,
          Token *args_4)

{
  Token name;
  Token initial;
  Token semi;
  UdpInitialStmtSyntax *value;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Token *in_RSI;
  Info *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  value = (UdpInitialStmtSyntax *)
          allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  initial.info = (Info *)*in_RDX;
  initial._0_8_ = in_RCX[1];
  name.info = (Info *)*in_RCX;
  name._0_8_ = in_R9[1];
  semi.info = in_R8;
  semi._0_8_ = in_R9;
  slang::syntax::UdpInitialStmtSyntax::UdpInitialStmtSyntax
            ((UdpInitialStmtSyntax *)*in_R9,initial,name,*in_RSI,(ExpressionSyntax *)value,semi);
  return value;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }